

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::~ImageT(ImageT<embree::Col3<unsigned_char>_> *this)

{
  ~ImageT(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ImageT() {
      delete[] data; data = nullptr;
    }